

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution1d.cpp
# Opt level: O3

int ncnn::convolution1d(Mat *bottom_blob,Mat *top_blob,Mat *weight_data,Mat *bias_data,int kernel_w,
                       int stride_w,int dilation_w,int activation_type,Mat *activation_params,
                       Option *opt)

{
  float fVar1;
  float fVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  void *pvVar7;
  void *pvVar8;
  size_t sVar9;
  size_t sVar10;
  int iVar11;
  long lVar12;
  float *pfVar13;
  long lVar14;
  float *pfVar15;
  ulong uVar16;
  float *pfVar17;
  ulong uVar18;
  bool bVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  ulong local_c0;
  
  uVar3 = top_blob->h;
  pvVar7 = bias_data->data;
  if (pvVar7 == (void *)0x0) {
    bVar19 = true;
    lVar12 = 0;
  }
  else {
    lVar12 = (long)bias_data->c * bias_data->cstep;
    bVar19 = lVar12 == 0;
  }
  iVar11 = (int)lVar12;
  if (0 < (int)uVar3) {
    uVar4 = bottom_blob->h;
    iVar5 = top_blob->w;
    pvVar8 = top_blob->data;
    sVar9 = top_blob->elemsize;
    iVar11 = 0;
    local_c0 = 0;
    do {
      if (0 < iVar5) {
        pfVar15 = (float *)bottom_blob->data;
        iVar6 = bottom_blob->w;
        sVar10 = bottom_blob->elemsize;
        lVar12 = 0;
        do {
          fVar22 = 0.0;
          if (!bVar19) {
            fVar22 = *(float *)((long)pvVar7 + local_c0 * 4);
          }
          if (0 < (int)uVar4) {
            uVar16 = 0;
            pfVar13 = pfVar15;
            lVar14 = (long)&weight_data->data + (long)iVar11 * 4;
            do {
              if (0 < kernel_w) {
                uVar18 = 0;
                pfVar17 = pfVar13;
                do {
                  fVar22 = fVar22 + *(float *)(lVar14 + uVar18 * 4) * *pfVar17;
                  uVar18 = uVar18 + 1;
                  pfVar17 = pfVar17 + dilation_w;
                } while ((uint)kernel_w != uVar18);
              }
              uVar16 = uVar16 + 1;
              lVar14 = lVar14 + (long)kernel_w * 4;
              pfVar13 = (float *)((long)pfVar13 + (long)iVar6 * sVar10);
            } while (uVar16 != uVar4);
          }
          fVar20 = fVar22;
          switch(activation_type) {
          case 1:
            if (fVar22 <= 0.0) {
              fVar20 = 0.0;
            }
            break;
          case 2:
            fVar20 = (float)(~-(uint)(0.0 < fVar22) & *(uint *)&activation_params->data |
                            -(uint)(0.0 < fVar22) & 0x3f800000) * fVar22;
            break;
          case 3:
            if (fVar22 <= *(float *)&activation_params->data) {
              fVar22 = *(float *)&activation_params->data;
            }
            fVar1 = *(float *)((long)&activation_params->data + 4);
            fVar20 = fVar22;
            if (fVar1 <= fVar22) {
              fVar20 = fVar1;
            }
            break;
          case 4:
            fVar22 = expf(-fVar22);
            fVar20 = 1.0 / (fVar22 + 1.0);
            break;
          case 5:
            fVar20 = expf(fVar22);
            fVar20 = logf(fVar20 + 1.0);
            fVar20 = tanhf(fVar20);
            fVar20 = fVar20 * fVar22;
            break;
          case 6:
            fVar1 = *(float *)&activation_params->data;
            fVar2 = *(float *)((long)&activation_params->data + 4);
            fVar21 = -fVar2 / fVar1;
            fVar20 = 0.0;
            if ((fVar21 <= fVar22) && (fVar20 = fVar22, fVar22 <= fVar21 + 1.0 / fVar1)) {
              fVar20 = (fVar1 * fVar22 + fVar2) * fVar22;
            }
          }
          *(float *)((long)pvVar8 + lVar12 * 4 + sVar9 * (long)iVar5 * local_c0) = fVar20;
          lVar12 = lVar12 + 1;
          pfVar15 = pfVar15 + stride_w;
        } while (lVar12 != iVar5);
      }
      local_c0 = local_c0 + 1;
      iVar11 = iVar11 + uVar4 * kernel_w;
    } while (local_c0 != uVar3);
  }
  return iVar11;
}

Assistant:

static int convolution1d(const Mat& bottom_blob, Mat& top_blob, const Mat& weight_data, const Mat& bias_data, int kernel_w, int stride_w, int dilation_w, int activation_type, const Mat& activation_params, const Option& opt)
{
    const int h = bottom_blob.h;

    const int outw = top_blob.w;
    const int outh = top_blob.h;

    const int bias_term = bias_data.empty() ? 0 : 1;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < outh; p++)
    {
        float* outptr = top_blob.row(p);

        for (int j = 0; j < outw; j++)
        {
            float sum = 0.f;

            if (bias_term)
                sum = bias_data[p];

            const float* kptr = (const float*)weight_data + kernel_w * h * p;

            for (int q = 0; q < h; q++)
            {
                const float* sptr = bottom_blob.row(q) + j * stride_w;

                for (int k = 0; k < kernel_w; k++)
                {
                    float val = *sptr;
                    float wt = kptr[k];
                    sum += val * wt;

                    sptr += dilation_w;
                }

                kptr += kernel_w;
            }

            sum = activation_ss(sum, activation_type, activation_params);

            outptr[j] = sum;
        }
    }

    return 0;
}